

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fStencilTests.cpp
# Opt level: O0

int __thiscall deqp::gles2::Functional::StencilTests::init(StencilTests *this,EVP_PKEY_CTX *ctx)

{
  deBool dVar1;
  SimpleStencilCase *pSVar2;
  StencilTests *this_local;
  
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"clear","Stencil clear",
               init()::Gen_clear::genOps(std::vector<deqp::gles2::Functional::StencilOp,std::
               allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"stencil_fail_replace",
               "Set stencil on stencil fail",
               init()::Gen_stencil_fail_replace::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"depth_fail_replace",
               "Set stencil on depth fail",
               init()::Gen_depth_fail_replace::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"depth_pass_replace",
               "Set stencil on depth pass",
               init()::Gen_depth_pass_replace::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"incr_stencil_fail",
               "Increment on stencil fail",
               init()::Gen_incr_stencil_fail::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"decr_stencil_fail",
               "Decrement on stencil fail",
               init()::Gen_decr_stencil_fail::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"incr_wrap_stencil_fail",
               "Increment (wrap) on stencil fail",
               init()::Gen_incr_wrap_stencil_fail::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"decr_wrap_stencil_fail",
               "Decrement (wrap) on stencil fail",
               init()::Gen_decr_wrap_stencil_fail::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"zero_stencil_fail",
               "Zero on stencil fail",
               init()::Gen_zero_stencil_fail::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"invert_stencil_fail",
               "Invert on stencil fail",
               init()::Gen_invert_stencil_fail::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"cmp_equal","Equality comparison",
               init()::Gen_cmp_equal::genOps(std::vector<deqp::gles2::Functional::StencilOp,std::
               allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"cmp_not_equal","Equality comparison",
               init()::Gen_cmp_not_equal::genOps(std::vector<deqp::gles2::Functional::StencilOp,std
               ::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"cmp_less_than","Less than comparison",
               init()::Gen_cmp_less_than::genOps(std::vector<deqp::gles2::Functional::StencilOp,std
               ::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"cmp_less_or_equal",
               "Less or equal comparison",
               init()::Gen_cmp_less_or_equal::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"cmp_greater_than",
               "Greater than comparison",
               init()::Gen_cmp_greater_than::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"cmp_greater_or_equal",
               "Greater or equal comparison",
               init()::Gen_cmp_greater_or_equal::genOps(std::vector<deqp::gles2::Functional::
               StencilOp,std::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    pSVar2 = (SimpleStencilCase *)operator_new(0x1e8);
    SimpleStencilCase::SimpleStencilCase
              (pSVar2,(this->super_TestCaseGroup).m_context,"cmp_mask_equal",
               "Equality comparison with mask",
               init()::Gen_cmp_mask_equal::genOps(std::vector<deqp::gles2::Functional::StencilOp,std
               ::allocator<deqp::gles2::Functional::StencilOp>_>__int_int_int_);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar2);
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  return 0;
}

Assistant:

void StencilTests::init (void)
{
#define STENCIL_CASE(NAME, DESCRIPTION, GEN_OPS_BODY)														\
	do {																									\
		struct Gen_##NAME {																					\
			static void genOps (vector<StencilOp>& dst, int stencilBits, int depthBits, int targetStencil)	\
			{																								\
				DE_UNREF(stencilBits && depthBits);															\
				GEN_OPS_BODY																				\
			}																								\
		};																									\
		addChild(new SimpleStencilCase(m_context, #NAME, DESCRIPTION, Gen_##NAME::genOps));					\
	} while (deGetFalse());

	STENCIL_CASE(clear, "Stencil clear",
		{
			// \note Unused bits are set to 1, clear should mask them out
			int mask = (1<<stencilBits)-1;
			dst.push_back(StencilOp::clearStencil(targetStencil | ~mask));
		});

	// Replace in different points
	STENCIL_CASE(stencil_fail_replace, "Set stencil on stencil fail",
		{
			dst.push_back(StencilOp::quad(GL_NEVER, targetStencil, GL_ALWAYS, 0.0f, GL_REPLACE, GL_KEEP, GL_KEEP));
		});
	STENCIL_CASE(depth_fail_replace, "Set stencil on depth fail",
		{
			dst.push_back(StencilOp::clearDepth(0.0f));
			dst.push_back(StencilOp::quad(GL_ALWAYS, targetStencil, GL_LESS, 0.5f, GL_KEEP, GL_REPLACE, GL_KEEP));
		});
	STENCIL_CASE(depth_pass_replace, "Set stencil on depth pass",
		{
			dst.push_back(StencilOp::quad(GL_ALWAYS, targetStencil, GL_LESS, 0.0f, GL_KEEP, GL_KEEP, GL_REPLACE));
		});

	// Increment, decrement
	STENCIL_CASE(incr_stencil_fail, "Increment on stencil fail",
		{
			if (targetStencil > 0)
			{
				dst.push_back(StencilOp::clearStencil(targetStencil-1));
				dst.push_back(StencilOp::quad(GL_EQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_INCR, GL_KEEP, GL_KEEP));
			}
			else
				dst.push_back(StencilOp::clearStencil(targetStencil));
		});
	STENCIL_CASE(decr_stencil_fail, "Decrement on stencil fail",
		{
			int maxStencil = (1<<stencilBits)-1;
			if (targetStencil < maxStencil)
			{
				dst.push_back(StencilOp::clearStencil(targetStencil+1));
				dst.push_back(StencilOp::quad(GL_EQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_DECR, GL_KEEP, GL_KEEP));
			}
			else
				dst.push_back(StencilOp::clearStencil(targetStencil));
		});
	STENCIL_CASE(incr_wrap_stencil_fail, "Increment (wrap) on stencil fail",
		{
			int maxStencil = (1<<stencilBits)-1;
			dst.push_back(StencilOp::clearStencil((targetStencil-1)&maxStencil));
			dst.push_back(StencilOp::quad(GL_EQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_INCR_WRAP, GL_KEEP, GL_KEEP));
		});
	STENCIL_CASE(decr_wrap_stencil_fail, "Decrement (wrap) on stencil fail",
		{
			int maxStencil = (1<<stencilBits)-1;
			dst.push_back(StencilOp::clearStencil((targetStencil+1)&maxStencil));
			dst.push_back(StencilOp::quad(GL_EQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_DECR_WRAP, GL_KEEP, GL_KEEP));
		});

	// Zero, Invert
	STENCIL_CASE(zero_stencil_fail, "Zero on stencil fail",
		{
			dst.push_back(StencilOp::clearStencil(targetStencil));
			dst.push_back(StencilOp::quad(GL_NOTEQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_ZERO, GL_KEEP, GL_KEEP));
			dst.push_back(StencilOp::quad(GL_EQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_REPLACE, GL_KEEP, GL_KEEP));
		});
	STENCIL_CASE(invert_stencil_fail, "Invert on stencil fail",
		{
			int mask = (1<<stencilBits)-1;
			dst.push_back(StencilOp::clearStencil((~targetStencil)&mask));
			dst.push_back(StencilOp::quad(GL_EQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_INVERT, GL_KEEP, GL_KEEP));
		});

	// Comparison modes
	STENCIL_CASE(cmp_equal, "Equality comparison",
		{
			int mask = (1<<stencilBits)-1;
			int inv  = (~targetStencil)&mask;
			dst.push_back(StencilOp::clearStencil(inv));
			dst.push_back(StencilOp::quad(GL_EQUAL, inv, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INVERT));
			dst.push_back(StencilOp::quad(GL_EQUAL, inv, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INVERT));
		});
	STENCIL_CASE(cmp_not_equal, "Equality comparison",
		{
			int mask = (1<<stencilBits)-1;
			int inv  = (~targetStencil)&mask;
			dst.push_back(StencilOp::clearStencil(inv));
			dst.push_back(StencilOp::quad(GL_NOTEQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INVERT));
			dst.push_back(StencilOp::quad(GL_NOTEQUAL, targetStencil, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INVERT));
		});
	STENCIL_CASE(cmp_less_than, "Less than comparison",
		{
			int maxStencil = (1<<stencilBits)-1;
			if (targetStencil < maxStencil)
			{
				dst.push_back(StencilOp::clearStencil(targetStencil+1));
				dst.push_back(StencilOp::quad(GL_LESS, targetStencil, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_DECR));
				dst.push_back(StencilOp::quad(GL_LESS, targetStencil, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_DECR));
			}
			else
				dst.push_back(StencilOp::clearStencil(targetStencil));
		});
	STENCIL_CASE(cmp_less_or_equal, "Less or equal comparison",
		{
			int maxStencil = (1<<stencilBits)-1;
			if (targetStencil < maxStencil)
			{
				dst.push_back(StencilOp::clearStencil(targetStencil+1));
				dst.push_back(StencilOp::quad(GL_LEQUAL, targetStencil+1, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_DECR));
				dst.push_back(StencilOp::quad(GL_LEQUAL, targetStencil+1, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_DECR));
			}
			else
				dst.push_back(StencilOp::clearStencil(targetStencil));
		});
	STENCIL_CASE(cmp_greater_than, "Greater than comparison",
		{
			if (targetStencil > 0)
			{
				dst.push_back(StencilOp::clearStencil(targetStencil-1));
				dst.push_back(StencilOp::quad(GL_GREATER, targetStencil, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INCR));
				dst.push_back(StencilOp::quad(GL_GREATER, targetStencil, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INCR));
			}
			else
				dst.push_back(StencilOp::clearStencil(targetStencil));
		});
	STENCIL_CASE(cmp_greater_or_equal, "Greater or equal comparison",
		{
			if (targetStencil > 0)
			{
				dst.push_back(StencilOp::clearStencil(targetStencil-1));
				dst.push_back(StencilOp::quad(GL_GEQUAL, targetStencil-1, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INCR));
				dst.push_back(StencilOp::quad(GL_GEQUAL, targetStencil-1, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INCR));
			}
			else
				dst.push_back(StencilOp::clearStencil(targetStencil));
		});
	STENCIL_CASE(cmp_mask_equal, "Equality comparison with mask",
		{
			int valMask = (1<<stencilBits)-1;
			int mask	= (1<<7)|(1<<5)|(1<<3)|(1<<1);
			dst.push_back(StencilOp::clearStencil(~targetStencil));
			StencilOp op = StencilOp::quad(GL_EQUAL, (~targetStencil | ~mask) & valMask, GL_ALWAYS, 0.0f, GL_KEEP, GL_KEEP, GL_INVERT);
			op.stencilMask = mask;
			dst.push_back(op);
		});
}